

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O2

void __thiscall higan::HttpServer::OnNewConnection(HttpServer *this,TcpConnectionPtr *connection)

{
  TcpConnection *pTVar1;
  HttpContext local_e8;
  string local_58;
  any local_38;
  allocator<char> local_21;
  
  pTVar1 = (connection->super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"HttpContext",&local_21);
  HttpContext::HttpContext(&local_e8);
  std::any::
  any<higan::HttpContext,higan::HttpContext,std::any::_Manager_external<higan::HttpContext>,void>
            (&local_38,&local_e8);
  TcpConnection::SetContext(pTVar1,&local_58,&local_38);
  std::any::reset(&local_38);
  HttpContext::~HttpContext(&local_e8);
  std::__cxx11::string::~string((string *)&local_58);
  pTVar1 = (connection->super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_58._M_dataplus._M_p = (pointer)OnMessageSendOver;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = (size_type)this;
  std::function<void(std::shared_ptr<higan::TcpConnection>const&)>::
  function<std::_Bind<void(higan::HttpServer::*(higan::HttpServer*,std::_Placeholder<1>))(std::shared_ptr<higan::TcpConnection>const&)>,void>
            ((function<void(std::shared_ptr<higan::TcpConnection>const&)> *)&local_e8,
             (_Bind<void_(higan::HttpServer::*(higan::HttpServer_*,_std::_Placeholder<1>))(const_std::shared_ptr<higan::TcpConnection>_&)>
              *)&local_58);
  TcpConnection::SetWriteOverCallback(pTVar1,(TcpConnectionCallback *)&local_e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  return;
}

Assistant:

void HttpServer::OnNewConnection(const TcpConnectionPtr& connection)
{
	connection->SetContext("HttpContext", HttpContext());
	connection->SetWriteOverCallback(std::bind(&HttpServer::OnMessageSendOver, this, _1));
}